

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::SetTrimIsoFlags(ON_Brep *this,ON_BrepTrim *trim)

{
  int iVar1;
  int iVar2;
  ISO IVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *this_00;
  ON_Surface *pOVar5;
  ON_Curve **ppOVar6;
  ON_Curve *local_60;
  undefined1 local_40 [8];
  ON_Interval PD;
  ON_Curve *pC;
  ON_Surface *pS;
  int fi;
  bool rc;
  ON_BrepTrim *trim_local;
  ON_Brep *this_local;
  
  pS._7_1_ = false;
  if ((-1 < trim->m_li) &&
     (iVar1 = trim->m_li,
     iVar2 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
     iVar1 < iVar2)) {
    pOVar4 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,trim->m_li);
    iVar1 = pOVar4->m_fi;
    if ((-1 < iVar1) &&
       (iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F),
       iVar1 < iVar2)) {
      this_00 = ON_ClassArray<ON_BrepFace>::operator[]
                          ((ON_ClassArray<ON_BrepFace> *)&this->m_F,iVar1);
      pOVar5 = ON_BrepFace::SurfaceOf(this_00);
      if (pOVar5 != (ON_Surface *)0x0) {
        if ((trim->m_c2i < 0) ||
           (iVar1 = trim->m_c2i,
           iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>)
           , iVar2 <= iVar1)) {
          local_60 = (ON_Curve *)0x0;
        }
        else {
          ppOVar6 = ON_SimpleArray<ON_Curve_*>::operator[]
                              (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,trim->m_c2i);
          local_60 = *ppOVar6;
        }
        PD.m_t[1] = (double)local_60;
        pS._7_1_ = local_60 != (ON_Curve *)0x0;
        if (pS._7_1_) {
          _local_40 = ON_CurveProxy::ProxyCurveDomain(&trim->super_ON_CurveProxy);
          IVar3 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2d])
                            (pOVar5,PD.m_t[1],local_40);
          trim->m_iso = IVar3;
        }
      }
    }
  }
  return pS._7_1_;
}

Assistant:

bool
ON_Brep::SetTrimIsoFlags( ON_BrepTrim& trim )
{
  bool rc = false;
  if ( trim.m_li >= 0 && trim.m_li < m_L.Count() )
  {
    const int fi = m_L[trim.m_li].m_fi;
    if ( fi >= 0 && fi < m_F.Count() )
    {
      const ON_Surface* pS = m_F[fi].SurfaceOf();
      if ( pS )
      {
        const ON_Curve* pC = (trim.m_c2i >= 0 && trim.m_c2i < m_C2.Count()) 
                           ? m_C2[trim.m_c2i]
                           : 0;
        if ( pC ) 
        {
          ON_Interval PD = trim.ProxyCurveDomain(); 
          trim.m_iso = pS->IsIsoparametric( *pC, &PD);
          rc = true;
        }
      }
    }
  }
  return rc;
}